

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O3

int main(void)

{
  test64<1000000001ul>();
  test64<1232445ul>();
  test64<67910ul>();
  test64<8ul>();
  test64<19ul>();
  test64<461ul>();
  test32<1000000001u>();
  test32<1232445u>();
  test32<67910u>();
  test32<8u>();
  test32<19u>();
  test32<461u>();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

  test64<1000000001>();
  test64<1232445>();
  test64<67910>();
  test64<8>();
  test64<19>();
  test64<461>();

  test32<1000000001>();
  test32<1232445>();
  test32<67910>();
  test32<8>();
  test32<19>();
  test32<461>();
  std::cout << "ok" << std::endl;
}